

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

bool helics::checkTypeMatch(string_view type1,string_view type2,bool strict_match)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  bool bVar1;
  iterator iVar2;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  byte in_R8B;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  _Self in_stack_fffffffffffffeb0;
  _Self in_stack_fffffffffffffeb8;
  _Self in_stack_fffffffffffffec0;
  _Self local_138 [3];
  size_t local_120;
  char *local_118;
  basic_string_view<char,_std::char_traits<char>_> *local_100;
  char *local_f8;
  basic_string_view<char,_std::char_traits<char>_> *local_e0;
  char *local_d8;
  size_t local_c0;
  char *local_b8;
  size_t local_a0;
  char *local_98;
  size_t local_80;
  char *local_78;
  size_t local_60;
  char *local_58;
  basic_string_view<char,_std::char_traits<char>_> *local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  byte local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_29 = in_R8B & 1;
  local_28._M_len = (size_t)in_RDX;
  local_28._M_str = in_RCX;
  local_18._M_len = in_RDI;
  local_18._M_str = in_RSI;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    local_40 = local_18._M_len;
    local_38 = local_18._M_str;
    local_50 = (basic_string_view<char,_std::char_traits<char>_> *)local_28._M_len;
    local_48 = local_28._M_str;
    __x._M_str = (char *)in_stack_fffffffffffffec0._M_node;
    __x._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
    __y._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
    __y._M_len = in_stack_fffffffffffffea8;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      local_60 = local_18._M_len;
      local_58 = local_18._M_str;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      __x_00._M_str = (char *)in_stack_fffffffffffffec0._M_node;
      __x_00._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
      __y_00._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
      __y_00._M_len = in_stack_fffffffffffffea8;
      bVar1 = std::operator==(__x_00,__y_00);
      if (!bVar1) {
        local_80 = local_18._M_len;
        local_78 = local_18._M_str;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        __x_01._M_str = (char *)in_stack_fffffffffffffec0._M_node;
        __x_01._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
        __y_01._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
        __y_01._M_len = in_stack_fffffffffffffea8;
        bVar1 = std::operator==(__x_01,__y_01);
        if (!bVar1) {
          local_a0 = local_18._M_len;
          local_98 = local_18._M_str;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          __x_02._M_str = (char *)in_stack_fffffffffffffec0._M_node;
          __x_02._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
          __y_02._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
          __y_02._M_len = in_stack_fffffffffffffea8;
          bVar1 = std::operator==(__x_02,__y_02);
          if (!bVar1) {
            local_c0 = local_18._M_len;
            local_b8 = local_18._M_str;
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
            __x_03._M_str = (char *)in_stack_fffffffffffffec0._M_node;
            __x_03._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
            __y_03._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
            __y_03._M_len = in_stack_fffffffffffffea8;
            bVar1 = std::operator==(__x_03,__y_03);
            if (!bVar1) {
              if ((local_29 & 1) != 0) {
                return false;
              }
              bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_28);
              if (!bVar1) {
                local_e0 = (basic_string_view<char,_std::char_traits<char>_> *)local_28._M_len;
                local_d8 = local_28._M_str;
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
                __x_04._M_str = (char *)in_stack_fffffffffffffec0._M_node;
                __x_04._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
                __y_04._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
                __y_04._M_len = in_stack_fffffffffffffea8;
                bVar1 = std::operator==(__x_04,__y_04);
                if (!bVar1) {
                  local_100 = (basic_string_view<char,_std::char_traits<char>_> *)local_28._M_len;
                  local_f8 = local_28._M_str;
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
                  __x_05._M_str = (char *)in_stack_fffffffffffffec0._M_node;
                  __x_05._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
                  __y_05._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
                  __y_05._M_len = in_stack_fffffffffffffea8;
                  bVar1 = std::operator==(__x_05,__y_05);
                  if (!bVar1) {
                    local_120 = local_18._M_len;
                    local_118 = local_18._M_str;
                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
                    __x_06._M_str = (char *)in_stack_fffffffffffffec0._M_node;
                    __x_06._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
                    __y_06._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
                    __y_06._M_len = in_stack_fffffffffffffea8;
                    bVar1 = std::operator==(__x_06,__y_06);
                    if (!bVar1) {
                      local_138[0]._M_node =
                           (_Base_ptr)
                           std::
                           set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ::find(in_stack_fffffffffffffe88,(key_type *)0x4e2bf6);
                      iVar2 = std::
                              set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ::end(in_stack_fffffffffffffe88);
                      bVar1 = std::operator==(local_138,(_Self *)&stack0xfffffffffffffec0);
                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                        CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                        basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                          local_28._M_len,in_stack_fffffffffffffe98);
                        __x_07._M_str = (char *)iVar2._M_node;
                        __x_07._M_len = (size_t)in_stack_fffffffffffffeb8._M_node;
                        __y_07._M_str = (char *)in_stack_fffffffffffffeb0._M_node;
                        __y_07._M_len = (size_t)local_28._M_str;
                        bVar1 = std::operator==(__x_07,__y_07);
                        return bVar1;
                      }
                      std::
                      set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::find(in_stack_fffffffffffffe88,(key_type *)0x4e2c37);
                      std::
                      set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ::end(in_stack_fffffffffffffe88);
                      bVar1 = std::operator==((_Self *)&stack0xfffffffffffffeb8,
                                              (_Self *)&stack0xfffffffffffffeb0);
                      return (bool)((bVar1 ^ 0xffU) & 1);
                    }
                  }
                }
              }
              return true;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool checkTypeMatch(std::string_view type1, std::string_view type2, bool strict_match)
{
    if ((type1.empty()) || (type1 == type2) || (type1 == "def") || (type1 == "any") ||
        (type1 == "raw") || (type1 == "json")) {
        return true;
    }
    if (strict_match) {
        return false;
    }

    if ((type2.empty()) || (type2 == "def") || (type2 == "any") || (type1 == "json")) {
        return true;
    }
    if (convertible_set.find(type1) != convertible_set.end()) {
        return ((convertible_set.find(type2) != convertible_set.end()));
    }
    return (type2 == "raw");
}